

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

Float __thiscall
pbrt::PiecewiseLinearSpectrum::operator()(PiecewiseLinearSpectrum *this,Float lambda)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  size_t sVar7;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  Float FVar8;
  Float t;
  int o;
  float local_14 [5];
  
  local_14[0] = in_XMM0_Da;
  bVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x78136e);
  fVar1 = local_14[0];
  if (((!bVar4) &&
      (pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::front(in_RDI),
      fVar2 = local_14[0], *pvVar6 <= fVar1)) &&
     (pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::back(in_RDI),
     fVar2 <= *pvVar6)) {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
    sVar7 = pbrt::operator()((size_t)local_14,(anon_class_16_2_46b023c2 *)in_RDI);
    iVar5 = (int)sVar7;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,(long)iVar5);
    fVar1 = *pvVar6;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,(long)(iVar5 + 1));
    fVar2 = *pvVar6;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI,(long)iVar5);
    fVar3 = *pvVar6;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI + 1,(long)iVar5);
    FVar8 = *pvVar6;
    pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (in_RDI + 1,(long)(iVar5 + 1));
    FVar8 = Lerp((local_14[0] - fVar1) / (fVar2 - fVar3),FVar8,*pvVar6);
    return FVar8;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU Float PiecewiseLinearSpectrum::operator()(Float lambda) const {
    // Handle _PiecewiseLinearSpectrum_ corner cases
    if (lambdas.empty() || lambda < lambdas.front() || lambda > lambdas.back())
        return 0;

    // Find offset to largest _lambdas_ below _lambda_ and interpolate
    int o = FindInterval(lambdas.size(), [&](int i) { return lambdas[i] <= lambda; });
    DCHECK(lambda >= lambdas[o] && lambda <= lambdas[o + 1]);
    Float t = (lambda - lambdas[o]) / (lambdas[o + 1] - lambdas[o]);
    return Lerp(t, values[o], values[o + 1]);
}